

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O2

void ContextBlockSplitterStoredFinishBlockLiterals
               (ContextBlockSplitter *self,MemoryManager *m,int is_final)

{
  int *piVar1;
  long *plVar2;
  uint uVar3;
  BlockSplit *pBVar4;
  size_t sVar5;
  ulong uVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  uint *puVar10;
  void *pvVar11;
  HistogramLiteral *pHVar12;
  uint *puVar13;
  void *__src;
  size_t sVar14;
  HistogramLiteral *pHVar15;
  size_t sVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  pBVar4 = self->split_;
  sVar5 = self->num_contexts_;
  sVar14 = self->num_blocks_;
  pHVar12 = self->histograms_;
  if (sVar14 == 0) {
    self->num_blocks_ = 1;
    self->num_types_ = self->num_types_ + 1;
    uVar6 = self->curr_histogram_ix_ + sVar5;
    self->curr_histogram_ix_ = uVar6;
    if (uVar6 < *self->histograms_size_) {
      pHVar12 = pHVar12 + uVar6;
      sVar14 = sVar5;
      while (bVar17 = sVar14 != 0, sVar14 = sVar14 - 1, bVar17) {
        memset(pHVar12,0,0x408);
        pHVar12->bit_cost_ = INFINITY;
        pHVar12 = pHVar12 + 1;
      }
    }
    self->block_size_ = 0;
  }
  else if (self->block_size_ != 0) {
    uVar6 = (ulong)pBVar4->types[sVar14];
    if (pBVar4->num_types <= uVar6) {
      uVar6 = 0;
    }
    uVar9 = self->num_types_;
    if ((uint8_t)uVar6 == (uint8_t)uVar9) {
      if (uVar9 < self->max_block_types_) {
        self->num_blocks_ = sVar14 + 1;
        self->num_types_ = uVar9 + 1;
        uVar6 = self->curr_histogram_ix_ + sVar5;
        self->curr_histogram_ix_ = uVar6;
        if (uVar6 < *self->histograms_size_) {
          pHVar12 = pHVar12 + uVar6;
          sVar14 = sVar5;
          while (bVar17 = sVar14 != 0, sVar14 = sVar14 - 1, bVar17) {
            memset(pHVar12,0,0x408);
            pHVar12->bit_cost_ = INFINITY;
            pHVar12 = pHVar12 + 1;
          }
        }
        self->block_size_ = 0;
        self->merge_last_count_ = 0;
      }
      else {
        pBVar4->types[sVar14] = '\0';
        if (sVar5 == 0) {
          pvVar7 = (void *)0x0;
        }
        else {
          pvVar7 = BrotliAllocate(m,sVar5 * 0x410);
        }
        pvVar11 = pvVar7;
        pHVar15 = pHVar12;
        for (sVar14 = 0; __src = pvVar7, sVar16 = sVar5, sVar14 != sVar5; sVar14 = sVar14 + 1) {
          puVar13 = (uint *)((long)pvVar7 + sVar14 * 0x410);
          memcpy(puVar13,pHVar12 + sVar14 + self->curr_histogram_ix_,0x410);
          plVar2 = (long *)((long)pvVar7 + sVar14 * 0x410 + 0x400);
          *plVar2 = *plVar2 + pHVar12[sVar14].total_count_;
          for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
            piVar1 = (int *)((long)pvVar11 + lVar8 * 4);
            *piVar1 = *piVar1 + pHVar15->data_[lVar8];
          }
          puVar10 = puVar13 + self->alphabet_size_;
          uVar6 = 0;
          if ((self->alphabet_size_ & 1) != 0) goto LAB_00132460;
          while (puVar13 < puVar10) {
            uVar3 = *puVar13;
            puVar13 = puVar13 + 1;
            uVar6 = uVar6 + uVar3;
            if (0xff < (ulong)uVar3) {
              log2((double)uVar3);
            }
LAB_00132460:
            uVar3 = *puVar13;
            puVar13 = puVar13 + 1;
            uVar6 = uVar6 + uVar3;
            if (0xff < (ulong)uVar3) {
              log2((double)uVar3);
            }
          }
          if (0xff < uVar6) {
            auVar19._8_4_ = (int)(uVar6 >> 0x20);
            auVar19._0_8_ = uVar6;
            auVar19._12_4_ = 0x45300000;
            log2((auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
          }
          pvVar11 = (void *)((long)pvVar11 + 0x410);
          pHVar15 = pHVar15 + 1;
        }
        while (sVar16 != 0) {
          memcpy(pHVar12,__src,0x410);
          sVar14 = self->curr_histogram_ix_;
          memset(pHVar12 + sVar14,0,0x408);
          pHVar12[sVar14].bit_cost_ = INFINITY;
          pHVar12 = pHVar12 + 1;
          __src = (void *)((long)__src + 0x410);
          sVar16 = sVar16 - 1;
        }
        self->num_blocks_ = self->num_blocks_ + 1;
        pBVar4->num_types = self->num_types_;
        self->block_size_ = 0;
        self->merge_last_count_ = 0;
        BrotliFree(m,pvVar7);
      }
    }
    else {
      if (sVar5 == 0) {
        pvVar7 = (void *)0x0;
      }
      else {
        pvVar7 = BrotliAllocate(m,sVar5 * 0x410);
      }
      pvVar11 = pvVar7;
      pHVar15 = pHVar12 + uVar6 * sVar5;
      for (sVar14 = 0; sVar14 != sVar5; sVar14 = sVar14 + 1) {
        puVar13 = (uint *)((long)pvVar7 + sVar14 * 0x410);
        memcpy(puVar13,pHVar12 + sVar14 + self->curr_histogram_ix_,0x410);
        plVar2 = (long *)((long)pvVar7 + sVar14 * 0x410 + 0x400);
        *plVar2 = *plVar2 + (pHVar12 + uVar6 * sVar5)[sVar14].total_count_;
        for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
          piVar1 = (int *)((long)pvVar11 + lVar8 * 4);
          *piVar1 = *piVar1 + pHVar15->data_[lVar8];
        }
        puVar10 = puVar13 + self->alphabet_size_;
        uVar9 = 0;
        if ((self->alphabet_size_ & 1) != 0) goto LAB_00132292;
        while (puVar13 < puVar10) {
          uVar3 = *puVar13;
          puVar13 = puVar13 + 1;
          uVar9 = uVar9 + uVar3;
          if (0xff < (ulong)uVar3) {
            log2((double)uVar3);
          }
LAB_00132292:
          uVar3 = *puVar13;
          puVar13 = puVar13 + 1;
          uVar9 = uVar9 + uVar3;
          if (0xff < (ulong)uVar3) {
            log2((double)uVar3);
          }
        }
        if (0xff < uVar9) {
          auVar18._8_4_ = (int)(uVar9 >> 0x20);
          auVar18._0_8_ = uVar9;
          auVar18._12_4_ = 0x45300000;
          log2((auVar18._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
        }
        pvVar11 = (void *)((long)pvVar11 + 0x410);
        pHVar15 = pHVar15 + 1;
      }
      pBVar4->types[self->num_blocks_] = (uint8_t)uVar6;
      pvVar11 = pvVar7;
      sVar14 = sVar5;
      while (bVar17 = sVar14 != 0, sVar14 = sVar14 - 1, bVar17) {
        memcpy(pHVar12 + uVar6 * sVar5,pvVar11,0x410);
        sVar16 = self->curr_histogram_ix_;
        memset(pHVar12 + sVar16,0,0x408);
        pHVar12[sVar16].bit_cost_ = INFINITY;
        pHVar12 = pHVar12 + 1;
        pvVar11 = (void *)((long)pvVar11 + 0x410);
      }
      self->num_blocks_ = self->num_blocks_ + 1;
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      BrotliFree(m,pvVar7);
    }
  }
  if (is_final != 0) {
    *self->histograms_size_ = sVar5 * pBVar4->num_types;
  }
  return;
}

Assistant:

static void ContextBlockSplitterStoredFinishBlockLiterals(
    ContextBlockSplitter* self, MemoryManager* m, BROTLI_BOOL is_final) {
  BlockSplit* split = self->split_;
  const size_t num_contexts = self->num_contexts_;
  HistogramLiteral* histograms = self->histograms_;
  if (self->num_blocks_ == 0) {
    /* Create a first block */
    ++self->num_blocks_;
    ++self->num_types_;
    self->curr_histogram_ix_ += num_contexts;
    if (self->curr_histogram_ix_ < *self->histograms_size_) {
      ClearHistogramsLiteral(
          &self->histograms_[self->curr_histogram_ix_], self->num_contexts_);
    }
    self->block_size_ = 0;
  } else if (self->block_size_ > 0) {
    uint8_t current_type = split->types[self->num_blocks_];
    if (current_type >= split->num_types) {
      current_type = 0;
    }

    if (current_type == (uint8_t)self->num_types_) {
      /* If max_block_types_ amount is reached merge with a block of type 0 */
      if (self->num_types_ >= self->max_block_types_) {
        current_type = 0;
        split->types[self->num_blocks_] = 0;
        /* Merge with the blocks of the same 0 block type */
        HistogramLiteral* combined_histo =
            BROTLI_ALLOC(m, HistogramLiteral, num_contexts);
        double combined_entropy[BROTLI_MAX_STATIC_CONTEXTS];
        size_t i;
        if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(combined_histo)) return;

        for (i = 0; i < num_contexts; ++i) {
          size_t curr_histo_ix = self->curr_histogram_ix_ + i;
          combined_histo[i] = histograms[curr_histo_ix];
          HistogramAddHistogramLiteral(&combined_histo[i],
              &histograms[current_type * num_contexts + i]);
          combined_entropy[i] = BitsEntropy(
              &combined_histo[i].data_[0], self->alphabet_size_);
        }

        for (i = 0; i < num_contexts; ++i) {
          histograms[current_type * num_contexts + i] =
              combined_histo[i];
          HistogramClearLiteral(&histograms[self->curr_histogram_ix_ + i]);
        }
        ++self->num_blocks_;
        split->num_types = self->num_types_;
        self->block_size_ = 0;
        self->merge_last_count_ = 0;
        BROTLI_FREE(m, combined_histo);
      } else {
        /* Create a new block type */
        ++self->num_blocks_;
        ++self->num_types_;
        self->curr_histogram_ix_ += num_contexts;
        if (self->curr_histogram_ix_ < *self->histograms_size_) {
          ClearHistogramsLiteral(
              &self->histograms_[self->curr_histogram_ix_], self->num_contexts_);
        }

        self->block_size_ = 0;
        self->merge_last_count_ = 0;
      }
    } else {
      /* Merge with the blocks of the same current_type block type */
      HistogramLiteral* combined_histo =
          BROTLI_ALLOC(m, HistogramLiteral, num_contexts);
      double combined_entropy[BROTLI_MAX_STATIC_CONTEXTS];
      size_t i;
      if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(combined_histo)) return;

      for (i = 0; i < num_contexts; ++i) {
        size_t curr_histo_ix = self->curr_histogram_ix_ + i;
        combined_histo[i] = histograms[curr_histo_ix];
        HistogramAddHistogramLiteral(&combined_histo[i],
            &histograms[current_type * num_contexts + i]);
        combined_entropy[i] = BitsEntropy(
            &combined_histo[i].data_[0], self->alphabet_size_);
      }
      split->types[self->num_blocks_] = current_type;
      for (i = 0; i < num_contexts; ++i) {
        histograms[current_type * num_contexts + i] =
            combined_histo[i];
        HistogramClearLiteral(&histograms[self->curr_histogram_ix_ + i]);
      }
      ++self->num_blocks_;
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      BROTLI_FREE(m, combined_histo);
    }
  }
  if (is_final) {
    *self->histograms_size_ = split->num_types * num_contexts;
  }
}